

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_range(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  TRef TVar4;
  TRef TVar5;
  GCstr *pGVar6;
  long lVar7;
  long in_RSI;
  GCobj *in_RDI;
  TRef tmp;
  TRef trslen_1;
  ptrdiff_t len;
  ptrdiff_t i;
  TRef trslen;
  TRef trptr;
  int32_t end;
  int32_t start;
  GCstr *str;
  TRef trend;
  TRef trstart;
  TRef tr0;
  TRef trlen;
  TRef trstr;
  TValue *in_stack_fffffffffffffe68;
  TraceError e;
  GCobj *pGVar8;
  undefined4 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined2 in_stack_fffffffffffffe76;
  IRRef1 IVar9;
  jit_State *in_stack_fffffffffffffe78;
  GCobj *J_00;
  undefined4 in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe84;
  undefined2 in_stack_fffffffffffffe86;
  GCobj *in_stack_fffffffffffffe88;
  undefined6 in_stack_fffffffffffffe90;
  IRRef1 in_stack_fffffffffffffe96;
  long local_158;
  uint local_148;
  uint local_144;
  IRRef1 local_134;
  IRRef1 local_130;
  
  TVar4 = lj_ir_tostr((jit_State *)
                      CONCAT26(in_stack_fffffffffffffe76,
                               CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)),
                      (TRef)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  IVar1 = (IRRef1)TVar4;
  *(undefined2 *)((long)in_RDI + 0xa4) = 0x4413;
  (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = IVar1;
  *(undefined2 *)((long)in_RDI + 0xa2) = 0;
  TVar4 = lj_opt_fold(in_stack_fffffffffffffe78);
  IVar2 = (IRRef1)TVar4;
  TVar4 = lj_ir_kint((jit_State *)
                     CONCAT26(in_stack_fffffffffffffe86,
                              CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                     (int32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  pGVar6 = argv2str((jit_State *)
                    CONCAT26(in_stack_fffffffffffffe76,
                             CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)),
                    in_stack_fffffffffffffe68);
  if (*(int *)(in_RSI + 0x10) == 0) {
    if (((*(TRef **)((long)in_RDI + 0x88))[1] & 0x1f000000) == 0) {
      local_144 = 1;
      TVar5 = lj_ir_kint((jit_State *)
                         CONCAT26(in_stack_fffffffffffffe86,
                                  CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                         (int32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      local_130 = (IRRef1)TVar5;
    }
    else {
      local_144 = argv2int(in_stack_fffffffffffffe78,
                           (TValue *)
                           CONCAT26(in_stack_fffffffffffffe76,
                                    CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)));
      TVar5 = lj_opt_narrow_toint((jit_State *)&in_stack_fffffffffffffe68->field_2,0);
      local_130 = (IRRef1)TVar5;
    }
    if (((*(TRef **)((long)in_RDI + 0x88))[1] == 0) ||
       (((*(TRef **)((long)in_RDI + 0x88))[2] & 0x1f000000) == 0)) {
      local_134 = local_130;
      local_148 = local_144;
    }
    else {
      TVar5 = lj_opt_narrow_toint((jit_State *)&in_stack_fffffffffffffe68->field_2,0);
      local_134 = (IRRef1)TVar5;
      local_148 = argv2int(in_stack_fffffffffffffe78,
                           (TValue *)
                           CONCAT26(in_stack_fffffffffffffe76,
                                    CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)));
    }
    e = (TraceError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  }
  else {
    local_144 = argv2int(in_stack_fffffffffffffe78,
                         (TValue *)
                         CONCAT26(in_stack_fffffffffffffe76,
                                  CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)));
    lj_opt_narrow_toint((jit_State *)&in_stack_fffffffffffffe68->field_2,0);
    if (((*(TRef **)((long)in_RDI + 0x88))[2] & 0x1f000000) == 0) {
      TVar5 = lj_ir_kint((jit_State *)
                         CONCAT26(in_stack_fffffffffffffe86,
                                  CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                         (int32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      local_134 = (IRRef1)TVar5;
      e = (TraceError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      local_148 = 0xffffffff;
    }
    else {
      TVar5 = lj_opt_narrow_toint((jit_State *)&in_stack_fffffffffffffe68->field_2,0);
      local_134 = (IRRef1)TVar5;
      e = (TraceError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      local_148 = argv2int(in_stack_fffffffffffffe78,
                           (TValue *)
                           CONCAT26(in_stack_fffffffffffffe76,
                                    CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)));
    }
  }
  if ((int)local_148 < 0) {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x93;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = local_134;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar4;
    lj_opt_fold(in_stack_fffffffffffffe78);
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x2913;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = IVar2;
    *(IRRef1 *)((long)in_RDI + 0xa2) = local_134;
    in_stack_fffffffffffffe88 = in_RDI;
    TVar5 = lj_opt_fold(in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe96 = (IRRef1)TVar5;
    TVar5 = lj_ir_kint((jit_State *)
                       CONCAT26(in_stack_fffffffffffffe86,
                                CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                       (int32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    *(undefined2 *)((long)in_stack_fffffffffffffe88 + 0xa4) = 0x2913;
    (((FoldState *)((long)in_stack_fffffffffffffe88 + 0xa0))->ins).field_0.op1 =
         in_stack_fffffffffffffe96;
    *(short *)((long)in_stack_fffffffffffffe88 + 0xa2) = (short)TVar5;
    TVar5 = lj_opt_fold(in_stack_fffffffffffffe78);
    local_148 = local_148 + pGVar6->len + 1;
    local_134 = (IRRef1)TVar5;
  }
  else if (pGVar6->len < local_148) {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x793;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = local_134;
    *(IRRef1 *)((long)in_RDI + 0xa2) = IVar2;
    lj_opt_fold(in_stack_fffffffffffffe78);
    local_148 = pGVar6->len;
    local_134 = IVar2;
  }
  else {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x693;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = local_134;
    *(IRRef1 *)((long)in_RDI + 0xa2) = IVar2;
    lj_opt_fold(in_stack_fffffffffffffe78);
  }
  TVar5 = recff_string_start((jit_State *)
                             CONCAT26(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90),
                             &in_stack_fffffffffffffe88->str,
                             (int32_t *)
                             CONCAT26(in_stack_fffffffffffffe86,
                                      CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
                             ,(TRef)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                             (TRef)in_stack_fffffffffffffe78,
                             CONCAT22(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74));
  IVar2 = (IRRef1)TVar5;
  if (*(int *)(in_RSI + 0x10) == 0) {
    lVar7 = (long)(int)(local_148 - local_144);
    if (lVar7 < 1) {
      *(undefined2 *)((long)in_RDI + 0xa4) = 0x293;
      (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = local_134;
      *(IRRef1 *)((long)in_RDI + 0xa2) = IVar2;
      lj_opt_fold(in_stack_fffffffffffffe78);
      *(undefined8 *)(in_RSI + 8) = 0;
    }
    else {
      *(undefined2 *)((long)in_RDI + 0xa4) = 0x2a13;
      (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = local_134;
      *(IRRef1 *)((long)in_RDI + 0xa2) = IVar2;
      TVar4 = lj_opt_fold(in_stack_fffffffffffffe78);
      IVar3 = (IRRef1)TVar4;
      J_00 = in_RDI;
      TVar4 = lj_ir_kint((jit_State *)
                         CONCAT26(IVar3,CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                )),(int32_t)((ulong)in_RDI >> 0x20));
      *(undefined2 *)((long)J_00 + 0xa4) = 0x893;
      (((FoldState *)((long)J_00 + 0xa0))->ins).field_0.op1 = IVar3;
      *(short *)((long)J_00 + 0xa2) = (short)TVar4;
      lj_opt_fold((jit_State *)&J_00->gch);
      if (0xfa < (long)((ulong)*(BCReg *)((long)in_RDI + 0x98) + lVar7)) {
        lj_trace_err_info((jit_State *)
                          CONCAT26(in_stack_fffffffffffffe76,
                                   CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)),e)
        ;
      }
      *(long *)(in_RSI + 8) = lVar7;
      for (local_158 = 0; local_158 < lVar7; local_158 = local_158 + 1) {
        pGVar8 = in_RDI;
        IVar9 = IVar2;
        TVar4 = lj_ir_kint((jit_State *)
                           CONCAT26(IVar3,CONCAT24(in_stack_fffffffffffffe84,
                                                   in_stack_fffffffffffffe80)),
                           (int32_t)((ulong)J_00 >> 0x20));
        *(undefined2 *)((long)pGVar8 + 0xa4) = 0x2913;
        (((FoldState *)((long)pGVar8 + 0xa0))->ins).field_0.op1 = IVar9;
        *(short *)((long)pGVar8 + 0xa2) = (short)TVar4;
        TVar4 = lj_opt_fold((jit_State *)&J_00->gch);
        *(undefined2 *)((long)in_RDI + 0xa4) = 0x3f05;
        (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = IVar1;
        *(short *)((long)in_RDI + 0xa2) = (short)TVar4;
        TVar4 = lj_opt_fold((jit_State *)&J_00->gch);
        *(undefined2 *)((long)in_RDI + 0xa4) = 0x4510;
        (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = (IRRef1)TVar4;
        *(undefined2 *)((long)in_RDI + 0xa2) = 1;
        TVar4 = lj_opt_fold((jit_State *)&J_00->gch);
        (*(TRef **)((long)in_RDI + 0x88))[local_158] = TVar4;
      }
    }
  }
  else if ((int)(local_148 - local_144) < 0) {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x93;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = local_134;
    *(IRRef1 *)((long)in_RDI + 0xa2) = IVar2;
    lj_opt_fold(in_stack_fffffffffffffe78);
    TVar4 = lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90),
                      in_stack_fffffffffffffe88,
                      CONCAT22(in_stack_fffffffffffffe86,in_stack_fffffffffffffe84));
    **(TRef **)((long)in_RDI + 0x88) = TVar4;
  }
  else {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x2a13;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = local_134;
    *(IRRef1 *)((long)in_RDI + 0xa2) = IVar2;
    TVar5 = lj_opt_fold(in_stack_fffffffffffffe78);
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x193;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = (IRRef1)TVar5;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar4;
    lj_opt_fold(in_stack_fffffffffffffe78);
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x3f05;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = IVar1;
    *(IRRef1 *)((long)in_RDI + 0xa2) = IVar2;
    TVar4 = lj_opt_fold(in_stack_fffffffffffffe78);
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x4d04;
    (((FoldState *)((long)in_RDI + 0xa0))->ins).field_0.op1 = (IRRef1)TVar4;
    *(IRRef1 *)((long)in_RDI + 0xa2) = (IRRef1)TVar5;
    TVar4 = lj_opt_fold(in_stack_fffffffffffffe78);
    **(TRef **)((long)in_RDI + 0x88) = TVar4;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_range(jit_State *J, RecordFFData *rd)
{
  TRef trstr = lj_ir_tostr(J, J->base[0]);
  TRef trlen = emitir(IRTI(IR_FLOAD), trstr, IRFL_STR_LEN);
  TRef tr0 = lj_ir_kint(J, 0);
  TRef trstart, trend;
  GCstr *str = argv2str(J, &rd->argv[0]);
  int32_t start, end;
  if (rd->data) {  /* string.sub(str, start [,end]) */
    start = argv2int(J, &rd->argv[1]);
    trstart = lj_opt_narrow_toint(J, J->base[1]);
    trend = J->base[2];
    if (tref_isnil(trend)) {
      trend = lj_ir_kint(J, -1);
      end = -1;
    } else {
      trend = lj_opt_narrow_toint(J, trend);
      end = argv2int(J, &rd->argv[2]);
    }
  } else {  /* string.byte(str, [,start [,end]]) */
    if (tref_isnil(J->base[1])) {
      start = 1;
      trstart = lj_ir_kint(J, 1);
    } else {
      start = argv2int(J, &rd->argv[1]);
      trstart = lj_opt_narrow_toint(J, J->base[1]);
    }
    if (J->base[1] && !tref_isnil(J->base[2])) {
      trend = lj_opt_narrow_toint(J, J->base[2]);
      end = argv2int(J, &rd->argv[2]);
    } else {
      trend = trstart;
      end = start;
    }
  }
  if (end < 0) {
    emitir(IRTGI(IR_LT), trend, tr0);
    trend = emitir(IRTI(IR_ADD), emitir(IRTI(IR_ADD), trlen, trend),
		   lj_ir_kint(J, 1));
    end = end+(int32_t)str->len+1;
  } else if ((MSize)end <= str->len) {
    emitir(IRTGI(IR_ULE), trend, trlen);
  } else {
    emitir(IRTGI(IR_UGT), trend, trlen);
    end = (int32_t)str->len;
    trend = trlen;
  }
  trstart = recff_string_start(J, str, &start, trstart, trlen, tr0);
  if (rd->data) {  /* Return string.sub result. */
    if (end - start >= 0) {
      /* Also handle empty range here, to avoid extra traces. */
      TRef trptr, trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_GE), trslen, tr0);
      trptr = emitir(IRT(IR_STRREF, IRT_PGC), trstr, trstart);
      J->base[0] = emitir(IRT(IR_SNEW, IRT_STR), trptr, trslen);
    } else {  /* Range underflow: return empty string. */
      emitir(IRTGI(IR_LT), trend, trstart);
      J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
    }
  } else {  /* Return string.byte result(s). */
    ptrdiff_t i, len = end - start;
    if (len > 0) {
      TRef trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_EQ), trslen, lj_ir_kint(J, (int32_t)len));
      if (J->baseslot + len > LJ_MAX_JSLOTS)
	lj_trace_err_info(J, LJ_TRERR_STACKOV);
      rd->nres = len;
      for (i = 0; i < len; i++) {
	TRef tmp = emitir(IRTI(IR_ADD), trstart, lj_ir_kint(J, (int32_t)i));
	tmp = emitir(IRT(IR_STRREF, IRT_PGC), trstr, tmp);
	J->base[i] = emitir(IRT(IR_XLOAD, IRT_U8), tmp, IRXLOAD_READONLY);
      }
    } else {  /* Empty range or range underflow: return no results. */
      emitir(IRTGI(IR_LE), trend, trstart);
      rd->nres = 0;
    }
  }
}